

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

void __thiscall
Protocol::MQTT::V5::ControlPacketSerializableImpl::dump
          (ControlPacketSerializableImpl *this,FastString *out,int indent)

{
  undefined8 uVar1;
  int iVar2;
  uint32 uVar3;
  uint uVar4;
  String SStack_38;
  
  iVar2 = (**this->header->_vptr_FixedHeaderBase)();
  uVar1 = *(undefined8 *)
           (Common::Helper::getControlPacketName(Protocol::MQTT::Common::ControlPacketType)::names +
           (long)iVar2 * 8);
  uVar3 = Common::VBInt::operator_cast_to_unsigned_int(&this->remLength);
  MQTTStringPrintf((char *)&SStack_38,"%*s%s control packet (rlength: %u)\n",(ulong)(uint)indent,"",
                   uVar1,(ulong)uVar3);
  Bstrlib::String::operator+=(out,&SStack_38);
  Bstrlib::String::~String(&SStack_38);
  uVar4 = indent + 2;
  (*this->header->_vptr_FixedHeaderBase[3])(this->header,out,(ulong)uVar4);
  (*(this->fixedVariableHeader->super_Serializable)._vptr_Serializable[3])
            (this->fixedVariableHeader,out,(ulong)uVar4);
  (*(this->props->super_Serializable)._vptr_Serializable[3])(this->props,out,(ulong)uVar4);
  (*(this->payload->super_EmptySerializable).super_Serializable._vptr_Serializable[3])
            (this->payload,out,(ulong)uVar4);
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*s%s control packet (rlength: %u)\n", (int)indent, "", Helper::getControlPacketName(header.getType()), (uint32)remLength);
                    header.dump(out, indent + 2);
                    fixedVariableHeader.dump(out, indent + 2);
                    props.dump(out, indent + 2);
                    payload.dump(out, indent + 2);
                }